

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line,long col)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  anon_enum_32 delim;
  long lVar5;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  string local_1c8;
  ostringstream error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type sStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  long local_168;
  long lStack_160;
  long local_158;
  long lStack_150;
  pointer local_148;
  pointer pcStack_140;
  pointer local_138;
  
  _error = (pointer)&local_198;
  sStack_180 = 0;
  local_178._8_8_ = 0;
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = 0;
  local_188._M_p = (pointer)&local_178;
  local_178._M_allocated_capacity = 0;
  local_168 = 0;
  lStack_160 = 0;
  local_158 = 0;
  lStack_150 = 0;
  local_148 = (pointer)0x0;
  pcStack_140 = (pointer)0x0;
  local_138 = (pointer)0x0;
  cmListFileFunction::operator=(&this->Function,(cmListFileFunction *)&error);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,name,(allocator<char> *)&lfc);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)&this->Function,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  (this->Function).super_cmCommandContext.Line = line;
  (this->Function).super_cmCommandContext.Col = col;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Unexpected end of file.\n");
      std::operator<<(poVar3,"Parse error.  Function missing opening \"(\".");
      std::__cxx11::stringbuf::str();
      IssueError(this,&lfc.Name);
      goto LAB_002da985;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type != cmListFileLexer_Token_ParenLeft) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Expected \"(\", got ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," with text \"");
    poVar3 = std::operator<<(poVar3,pcVar2->text);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    IssueError(this,&lfc.Name);
LAB_002da985:
    std::__cxx11::string::~string((string *)&lfc);
LAB_002da98f:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    return false;
  }
  delim = SeparationOkay;
  lVar5 = 0;
LAB_002da643:
  this->Separation = delim;
LAB_002da649:
  pcVar2 = cmListFileLexer_Scan(this->Lexer);
  if (pcVar2 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    std::__cxx11::string::assign((char *)&lfc.FilePath);
    lfc.Line = line;
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               &this->Backtrace);
    cmListFileBacktrace::Push((cmListFileBacktrace *)&local_1c8,(cmListFileContext *)&lfbt);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8._M_string_length);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
    std::operator<<(poVar3,"End of file reached.");
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_1c8,&lfbt);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmListFileContext::~cmListFileContext(&lfc);
    goto LAB_002da98f;
  }
  switch(pcVar2->type) {
  case cmListFileLexer_Token_Space:
  case cmListFileLexer_Token_Newline:
    this->Separation = SeparationOkay;
    goto LAB_002da649;
  case cmListFileLexer_Token_Identifier:
  case cmListFileLexer_Token_ArgumentUnquoted:
    goto switchD_002da672_caseD_3;
  case cmListFileLexer_Token_ParenLeft:
    goto switchD_002da672_caseD_4;
  case cmListFileLexer_Token_ParenRight:
    if (lVar5 == 0) {
      (this->Function).super_cmCommandContext.EndLine = (long)pcVar2->line;
      (this->Function).super_cmCommandContext.EndCol = (long)pcVar2->column;
      return true;
    }
    this->Separation = SeparationOkay;
    bVar1 = AddArgument(this,pcVar2,Unquoted);
    if (!bVar1) {
      return false;
    }
    lVar5 = lVar5 + -1;
    delim = SeparationWarning;
    goto LAB_002da643;
  case cmListFileLexer_Token_ArgumentQuoted:
    delim = SeparationWarning;
    break;
  case cmListFileLexer_Token_ArgumentBracket:
    delim = SeparationError;
    break;
  case cmListFileLexer_Token_CommentBracket:
    delim = SeparationError;
    goto LAB_002da643;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
    poVar3 = std::operator<<(poVar3,"Instead found ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," with text \"");
    poVar3 = std::operator<<(poVar3,pcVar2->text);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    IssueError(this,&lfc.Name);
    goto LAB_002da985;
  }
  bVar1 = AddArgument(this,pcVar2,delim);
  goto LAB_002da716;
switchD_002da672_caseD_4:
  lVar5 = lVar5 + 1;
  this->Separation = SeparationOkay;
  bVar1 = AddArgument(this,pcVar2,Unquoted);
  if (!bVar1) {
    return false;
  }
  goto LAB_002da649;
switchD_002da672_caseD_3:
  bVar1 = AddArgument(this,pcVar2,Unquoted);
  delim = SeparationWarning;
LAB_002da716:
  if (bVar1 == false) {
    return false;
  }
  goto LAB_002da643;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line, long col)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;
  this->Function.Col = col;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->Function.EndLine = token->line;
        this->Function.EndCol = token->column;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}